

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# experiment_helpers.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * opengv::getNindices(int n)

{
  int in_ESI;
  vector<int,_std::allocator<int>_> *in_RDI;
  int i;
  vector<int,_std::allocator<int>_> *indices;
  value_type_conflict *in_stack_ffffffffffffffd8;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffe0;
  undefined4 local_14;
  
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1293083);
  for (local_14 = 0; local_14 < in_ESI; local_14 = local_14 + 1) {
    std::vector<int,_std::allocator<int>_>::push_back
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  }
  return in_RDI;
}

Assistant:

std::vector<int>
opengv::getNindices( int n )
{
  std::vector<int> indices;
  for(int i = 0; i < n; i++)
    indices.push_back(i);
  return indices;
}